

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deffunc.cpp
# Opt level: O0

int __thiscall
ICM::DefFunc::Calc::Add<17UL>::sign
          (Add<17UL> *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t *siglen,uchar *tbs,size_t tbslen)

{
  TypeObject local_60;
  TypeObject local_48;
  InitList local_30;
  DefaultType local_1c;
  EVP_PKEY_CTX *pEStack_18;
  DefaultType t;
  Add<17UL> *this_local;
  
  local_1c = T_List;
  pEStack_18 = ctx;
  this_local = this;
  TypeObject::TypeObject(&local_48,&local_1c);
  local_30._M_array = &local_48;
  local_30._M_len = 1;
  TypeObject::TypeObject(&local_60,&local_1c);
  Function::Signature::Signature((Signature *)this,&local_30,&local_60,true);
  return (int)this;
}

Assistant:

S sign() const {
					DefaultType t = (DefaultType)_TU;
					return S({ t }, t, true); // T* -> T
				}